

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O3

void sx__coro_return(sx_coro_context *ctx,sx_fiber_t *pfrom,sx_coro_ret_type type,int arg)

{
  int iVar1;
  sx__coro_state *psVar2;
  sx__coro_state *psVar3;
  sx__coro_state *psVar4;
  sx_pool *psVar5;
  code *pcVar6;
  sx_fiber_t pvVar7;
  sx__pool_page *psVar8;
  
  psVar2 = ctx->cur_coro;
  if (psVar2 == (sx__coro_state *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                      0x135,
                      "You must call this function from within sx_fiber_cb invoked by sx_fiber_invoke"
                     );
    pcVar6 = (code *)swi(3);
    (*pcVar6)();
    return;
  }
  if (type == CORO_RET_END) {
    psVar3 = psVar2->next;
    psVar4 = psVar2->prev;
    if (psVar4 != (sx__coro_state *)0x0) {
      psVar4->next = psVar3;
    }
    if (psVar3 != (sx__coro_state *)0x0) {
      psVar3->prev = psVar4;
    }
    if (ctx->run_list == psVar2) {
      ctx->run_list = psVar3;
    }
    if (ctx->run_list_last == psVar2) {
      ctx->run_list_last = psVar2->prev;
    }
    psVar2->next = (sx__coro_state *)0x0;
    psVar2->prev = (sx__coro_state *)0x0;
    psVar5 = ctx->coro_pool;
    psVar8 = psVar5->pages;
    if (psVar8 != (sx__pool_page *)0x0) {
      do {
        psVar3 = (sx__coro_state *)psVar8->buff;
        if ((psVar3 <= psVar2) &&
           (psVar2 < (sx__coro_state *)
                     ((long)&psVar3->fiber + (long)psVar5->item_sz * (long)psVar5->capacity))) {
          if ((ulong)((long)psVar2 - (long)psVar3) % (ulong)(long)psVar5->item_sz != 0) {
            sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                              ,0xd6,"ptr is not aligned to items, probably invalid");
            pcVar6 = (code *)swi(3);
            (*pcVar6)();
            return;
          }
          iVar1 = psVar8->iter;
          if (iVar1 == psVar5->capacity) {
            sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                              ,0xd8,"cannot delete more objects, possible double delete");
            pcVar6 = (code *)swi(3);
            (*pcVar6)();
            return;
          }
          psVar8->iter = iVar1 + 1;
          psVar8->ptrs[iVar1] = psVar2;
          goto LAB_0010d367;
        }
        psVar8 = psVar8->next;
      } while (psVar8 != (sx__pool_page *)0x0);
    }
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                      ,0xe0,"pointer does not blong to the pool");
    pcVar6 = (code *)swi(3);
    (*pcVar6)();
    return;
  }
  psVar2->ret_state = type;
  (psVar2->counter).tm = 0.0;
  if (type == CORO_RET_WAIT) {
    (psVar2->arg).tm = (float)arg * 0.001;
  }
  else {
    (psVar2->arg).n = arg;
  }
LAB_0010d367:
  ctx->cur_coro = (sx__coro_state *)0x0;
  pvVar7 = (sx_fiber_t)jump_fcontext(*pfrom,0);
  *pfrom = pvVar7;
  return;
}

Assistant:

static inline void sx__coro_return(sx_coro_context* ctx, sx_fiber_t* pfrom, sx_coro_ret_type type,
                                   int arg)
{
    sx_assertf(ctx->cur_coro,
              "You must call this function from within sx_fiber_cb invoked by sx_fiber_invoke");
    sx_assertf(type != CORO_RET_NONE, "Invalid enum for type");

    sx__coro_state* fs = ctx->cur_coro;

    // If fiber is finished, just remove it from the list
    if (type == CORO_RET_END) {
        sx__coro_remove_list(&ctx->run_list, &ctx->run_list_last, fs);
        sx_pool_del(ctx->coro_pool, fs);
    } else {
        fs->ret_state = type;
        fs->counter.n = 0;
        if (type == CORO_RET_WAIT)
            fs->arg.tm = ((float)arg) * 0.001f;    // Convert msecs to seconds
        else if (type == CORO_RET_YIELD)
            fs->arg.n = arg;    // Number of next update passes
    }

    ctx->cur_coro = NULL;
    *pfrom = sx_fiber_switch(*pfrom, NULL).from;
}